

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_neg(secp256k1_ge *r,secp256k1_ge *a)

{
  secp256k1_ge *in_RSI;
  secp256k1_ge *in_RDI;
  
  secp256k1_ge_verify(in_RSI);
  memcpy(in_RDI,in_RSI,0x58);
  secp256k1_fe_impl_normalize_weak(&in_RDI->y);
  secp256k1_fe_impl_negate_unchecked(&in_RDI->y,&in_RDI->y,1);
  secp256k1_ge_verify(in_RDI);
  return;
}

Assistant:

static void secp256k1_ge_neg(secp256k1_ge *r, const secp256k1_ge *a) {
    secp256k1_ge_verify(a);
    *r = *a;
    secp256k1_fe_normalize_weak(&r->y);
    secp256k1_fe_negate(&r->y, &r->y, 1);
    secp256k1_ge_verify(r);
}